

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect-error-after-write.c
# Opt level: O1

int run_test_tcp_connect_error_after_write(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  code **ppcVar3;
  int64_t eval_b_2;
  int64_t eval_b_3;
  sockaddr_in addr;
  uv_connect_t connect_req;
  uv_write_t write_req;
  uv_tcp_t conn;
  undefined8 uStack_258;
  code *apcStack_250 [2];
  long local_240;
  long local_238;
  undefined1 local_230 [16];
  undefined1 local_220 [16];
  long local_210 [13];
  long local_1a8 [25];
  long local_e0 [27];
  
  apcStack_250[0] = (code *)0x1ca3be;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_220);
  local_e0[0] = (long)iVar1;
  local_1a8[0] = 0;
  if (local_e0[0] == 0) {
    apcStack_250[0] = (code *)0x1ca3fb;
    local_230 = uv_buf_init("TEST",4);
    apcStack_250[0] = (code *)0x1ca40a;
    uVar2 = uv_default_loop();
    apcStack_250[0] = (code *)0x1ca41a;
    iVar1 = uv_tcp_init(uVar2,local_e0);
    local_1a8[0] = (long)iVar1;
    local_210[0] = 0;
    if (local_1a8[0] != 0) goto LAB_001ca61d;
    apcStack_250[0] = (code *)0x1ca466;
    iVar1 = uv_write(local_1a8,local_e0,local_230,1,write_cb);
    local_210[0] = (long)iVar1;
    local_240 = -9;
    if (local_210[0] != -9) goto LAB_001ca62f;
    apcStack_250[0] = (code *)0x1ca4a4;
    iVar1 = uv_tcp_connect(local_210,local_e0,local_220,connect_cb);
    local_240 = (long)iVar1;
    local_238 = 0;
    if (local_240 != 0) goto LAB_001ca63e;
    apcStack_250[0] = (code *)0x1ca4ea;
    iVar1 = uv_write(local_1a8,local_e0,local_230,1,write_cb);
    local_240 = (long)iVar1;
    local_238 = 0;
    if (local_240 != 0) goto LAB_001ca64d;
    apcStack_250[0] = (code *)0x1ca50f;
    uVar2 = uv_default_loop();
    apcStack_250[0] = (code *)0x1ca519;
    iVar1 = uv_run(uVar2,0);
    local_240 = (long)iVar1;
    local_238 = 0;
    if (local_240 != 0) goto LAB_001ca65c;
    local_240 = 1;
    local_238 = (long)connect_cb_called;
    if (local_238 != 1) goto LAB_001ca66b;
    local_240 = 1;
    local_238 = (long)write_cb_called;
    if (local_238 != 1) goto LAB_001ca67a;
    local_240 = 1;
    local_238 = (long)close_cb_called;
    if (local_238 == 1) {
      apcStack_250[0] = (code *)0x1ca5ad;
      uVar2 = uv_default_loop();
      apcStack_250[0] = (code *)0x1ca5c1;
      uv_walk(uVar2,close_walk_cb,0);
      apcStack_250[0] = (code *)0x1ca5cb;
      uv_run(uVar2,0);
      local_240 = 0;
      apcStack_250[0] = (code *)0x1ca5d9;
      uVar2 = uv_default_loop();
      apcStack_250[0] = (code *)0x1ca5e1;
      iVar1 = uv_loop_close(uVar2);
      local_238 = (long)iVar1;
      if (local_240 == local_238) {
        apcStack_250[0] = (code *)0x1ca5fd;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001ca698;
    }
  }
  else {
    apcStack_250[0] = (code *)0x1ca61d;
    run_test_tcp_connect_error_after_write_cold_1();
LAB_001ca61d:
    apcStack_250[0] = (code *)0x1ca62f;
    run_test_tcp_connect_error_after_write_cold_2();
LAB_001ca62f:
    apcStack_250[0] = (code *)0x1ca63e;
    run_test_tcp_connect_error_after_write_cold_3();
LAB_001ca63e:
    apcStack_250[0] = (code *)0x1ca64d;
    run_test_tcp_connect_error_after_write_cold_4();
LAB_001ca64d:
    apcStack_250[0] = (code *)0x1ca65c;
    run_test_tcp_connect_error_after_write_cold_5();
LAB_001ca65c:
    apcStack_250[0] = (code *)0x1ca66b;
    run_test_tcp_connect_error_after_write_cold_6();
LAB_001ca66b:
    apcStack_250[0] = (code *)0x1ca67a;
    run_test_tcp_connect_error_after_write_cold_7();
LAB_001ca67a:
    apcStack_250[0] = (code *)0x1ca689;
    run_test_tcp_connect_error_after_write_cold_8();
  }
  apcStack_250[0] = (code *)0x1ca698;
  run_test_tcp_connect_error_after_write_cold_9();
LAB_001ca698:
  iVar1 = (int)&local_238;
  apcStack_250[0] = write_cb;
  run_test_tcp_connect_error_after_write_cold_10();
  apcStack_250[0] = (code *)(long)iVar1;
  uStack_258 = 0;
  if ((long)apcStack_250[0] < 0) {
    write_cb_called = write_cb_called + 1;
    return iVar1;
  }
  ppcVar3 = apcStack_250;
  iVar1 = (int)&uStack_258;
  write_cb_cold_1();
  if (iVar1 < 0) {
    connect_cb_called = connect_cb_called + 1;
    iVar1 = uv_close(ppcVar3[10],close_cb);
    return iVar1;
  }
  connect_cb_cold_1();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(tcp_connect_error_after_write) {
#ifdef _WIN32
  RETURN_SKIP("This test is disabled on Windows for now. "
              "See https://github.com/joyent/libuv/issues/444\n");
#else

  uv_connect_t connect_req;
  struct sockaddr_in addr;
  uv_write_t write_req;
  uv_tcp_t conn;
  uv_buf_t buf;
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  buf = uv_buf_init("TEST", 4);

  r = uv_tcp_init(uv_default_loop(), &conn);
  ASSERT_OK(r);

  r = uv_write(&write_req, (uv_stream_t*)&conn, &buf, 1, write_cb);
  ASSERT_EQ(r, UV_EBADF);

  r = uv_tcp_connect(&connect_req,
                     &conn,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT_OK(r);

  r = uv_write(&write_req, (uv_stream_t*)&conn, &buf, 1, write_cb);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, connect_cb_called);
  ASSERT_EQ(1, write_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
#endif
}